

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::ensure(JSPrinter *this,int safety)

{
  ulong uVar1;
  char *pcVar2;
  size_t __size;
  ulong uVar3;
  
  if (this->size < this->used + (long)safety) {
    uVar1 = this->size * 2;
    uVar3 = 0x400;
    if (0x400 < uVar1) {
      uVar3 = uVar1;
    }
    __size = uVar3 + (long)safety;
    this->size = __size;
    if (this->buffer == (char *)0x0) {
      pcVar2 = (char *)malloc(__size);
      this->buffer = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_00d43562;
    }
    else {
      pcVar2 = (char *)realloc(this->buffer,__size);
      if (pcVar2 == (char *)0x0) {
        free(this->buffer);
        __size = this->size;
LAB_00d43562:
        fprintf(_stderr,"Out of memory allocating %zd bytes for output buffer!\n",__size);
        abort();
      }
      this->buffer = pcVar2;
    }
  }
  return;
}

Assistant:

void ensure(int safety = 100) {
    if (size >= used + safety) {
      return;
    }
    size = std::max((size_t)1024, size * 2) + safety;
    if (!buffer) {
      buffer = (char*)malloc(size);
      if (!buffer) {
        errv("Out of memory allocating %zd bytes for output buffer!", size);
        abort();
      }
    } else {
      char* buf = (char*)realloc(buffer, size);
      if (!buf) {
        free(buffer);
        errv("Out of memory allocating %zd bytes for output buffer!", size);
        abort();
      }
      buffer = buf;
    }
  }